

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

string * __thiscall CTransaction::ToString_abi_cxx11_(CTransaction *this)

{
  long lVar1;
  bool bVar2;
  Txid *args_3;
  reference this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  CTxOut *tx_out;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1_2;
  CTxIn *tx_in_1;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1_1;
  CTxIn *tx_in;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  string *str;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  CTransaction *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__pos;
  CTxIn *in_stack_fffffffffffffde0;
  CScriptWitness *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  uint *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __pos = in_RDI;
  std::__cxx11::string::string(in_RDI);
  args_3 = GetHash(in_stack_fffffffffffffda8);
  transaction_identifier<false>::ToString_abi_cxx11_
            ((transaction_identifier<false> *)in_stack_fffffffffffffdb0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_RSI,(size_type)__pos,(size_type)in_RDI);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RSI[1].field_2;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::size(&in_stack_fffffffffffffda8->vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::size
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffda8);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&in_RSI[1].field_2._M_allocated_capacity + 4);
  tinyformat::format<std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long,unsigned_int>
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,(uint *)in_stack_fffffffffffffde8,
             (unsigned_long *)in_stack_fffffffffffffde0,(unsigned_long *)args_3,
             in_stack_ffffffffffffff90);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (this_02,in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string(this_01);
  std::__cxx11::string::~string(this_01);
  std::__cxx11::string::~string(this_01);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdb0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdb0);
  while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                           ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)this_02,
                            (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_stack_fffffffffffffdb0), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
              this_01);
    CTxIn::ToString_abi_cxx11_(in_stack_fffffffffffffde0);
    std::operator+((char *)in_RDI,this_02);
    std::operator+(in_RDI,(char *)this_02);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this_02,in_stack_fffffffffffffdb0);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               this_01);
  }
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdb0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffdb0);
  while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                           ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)this_02,
                            (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_stack_fffffffffffffdb0), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
              this_01);
    CScriptWitness::ToString_abi_cxx11_(in_stack_fffffffffffffde8);
    std::operator+((char *)in_RDI,this_02);
    std::operator+(in_RDI,(char *)this_02);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this_02,in_stack_fffffffffffffdb0);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               this_01);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffdb0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::end
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffdb0);
  while (bVar2 = __gnu_cxx::
                 operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                           ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                             *)this_02,
                            (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                             *)in_stack_fffffffffffffdb0), ((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
              operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                         *)this_01);
    CTxOut::ToString_abi_cxx11_(this_00);
    std::operator+((char *)in_RDI,this_02);
    std::operator+(in_RDI,(char *)this_02);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (this_02,in_stack_fffffffffffffdb0);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(this_01);
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
               this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __pos;
}

Assistant:

std::string CTransaction::ToString() const
{
    std::string str;
    str += strprintf("CTransaction(hash=%s, ver=%u, vin.size=%u, vout.size=%u, nLockTime=%u)\n",
        GetHash().ToString().substr(0,10),
        version,
        vin.size(),
        vout.size(),
        nLockTime);
    for (const auto& tx_in : vin)
        str += "    " + tx_in.ToString() + "\n";
    for (const auto& tx_in : vin)
        str += "    " + tx_in.scriptWitness.ToString() + "\n";
    for (const auto& tx_out : vout)
        str += "    " + tx_out.ToString() + "\n";
    return str;
}